

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codewriter_p.h
# Opt level: O0

Error __thiscall asmjit::v1_14::CodeWriter::ensureSpace(CodeWriter *this,BaseAssembler *a,size_t n)

{
  Error EVar1;
  BaseEmitter *this_00;
  ulong in_RDX;
  size_t in_RSI;
  CodeBuffer *in_RDI;
  Error err;
  CodeBuffer *buffer;
  size_t remainingSpace;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((ulong)(*(long *)(in_RSI + 0xa0) - (long)in_RDI->_data) < in_RDX) {
    this_00 = (BaseEmitter *)(*(long *)(in_RSI + 0x90) + 0x48);
    EVar1 = CodeHolder::growBuffer
                      ((CodeHolder *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,in_RSI);
    if (EVar1 != 0) {
      EVar1 = BaseEmitter::reportError(this_00,EVar1,(char *)in_RDI);
      return EVar1;
    }
    in_RDI->_data = *(uint8_t **)(in_RSI + 0xa8);
  }
  return 0;
}

Assistant:

ASMJIT_FORCE_INLINE Error ensureSpace(BaseAssembler* a, size_t n) noexcept {
    size_t remainingSpace = (size_t)(a->_bufferEnd - _cursor);
    if (ASMJIT_UNLIKELY(remainingSpace < n)) {
      CodeBuffer& buffer = a->_section->_buffer;
      Error err = a->_code->growBuffer(&buffer, n);
      if (ASMJIT_UNLIKELY(err))
        return a->reportError(err);
      _cursor = a->_bufferPtr;
    }
    return kErrorOk;
  }